

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void trompeloeil::report_match<std::__cxx11::string(int)>
               (call_matcher_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                *matcher_list)

{
  list_elem<trompeloeil::call_matcher_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>_>
  *plVar1;
  char *in_stack_ffffffffffffffd0;
  long *local_28 [2];
  long local_18 [2];
  
  plVar1 = (matcher_list->
           super_list<trompeloeil::call_matcher_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>,_trompeloeil::ignore_disposer>
           ).
           super_list_elem<trompeloeil::call_matcher_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>_>
           .next;
  if (plVar1 != (list_elem<trompeloeil::call_matcher_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>_>
                 *)matcher_list) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_28,(char *)plVar1[1].prev,(allocator<char> *)&stack0xffffffffffffffd7
              );
    reporter<trompeloeil::specialized>::sendOk(in_stack_ffffffffffffffd0);
    if (local_28[0] != local_18) {
      operator_delete(local_28[0],local_18[0] + 1);
    }
  }
  return;
}

Assistant:

auto
  list<T, Disposer>::begin()
  const
  noexcept
  -> iterator
  {
    return iterator{next};
  }